

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::WriteTestResultFooter
          (cmCTestTestHandler *this,cmXMLWriter *xml,cmCTestTestResult *result)

{
  cmCTestTestResult *pcVar1;
  bool bVar2;
  reference value;
  allocator local_91;
  string local_90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  const_iterator li;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  allocator local_41;
  string local_40;
  cmCTestTestResult *local_20;
  cmCTestTestResult *result_local;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  local_20 = result;
  result_local = (cmCTestTestResult *)xml;
  xml_local = (cmXMLWriter *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&result->Properties->Labels);
  pcVar1 = result_local;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Labels",&local_41);
    cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    li._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &local_20->Properties->Labels;
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)li._M_current);
    while( true ) {
      local_70._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(li._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_68,&local_70);
      pcVar1 = result_local;
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"Label",&local_91);
      value = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_68);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)pcVar1,&local_90,value);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_68);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)result_local);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)result_local);
  return;
}

Assistant:

void cmCTestTestHandler::WriteTestResultFooter(cmXMLWriter& xml,
                                               cmCTestTestResult* result)
{
  if (!result->Properties->Labels.empty()) {
    xml.StartElement("Labels");
    std::vector<std::string> const& labels = result->Properties->Labels;
    for (std::vector<std::string>::const_iterator li = labels.begin();
         li != labels.end(); ++li) {
      xml.Element("Label", *li);
    }
    xml.EndElement(); // Labels
  }

  xml.EndElement(); // Test
}